

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles31::Functional::PackUnorm4x8Case::iterate(PackUnorm4x8Case *this)

{
  ShaderExecutor *pSVar1;
  deUint32 dVar2;
  pointer pVVar3;
  pointer pVVar4;
  ulong uVar5;
  char *description;
  int iVar6;
  long lVar7;
  Hex<8UL> hex;
  long lVar8;
  Hex<8UL> hex_00;
  int iVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  uint uVar21;
  int iVar22;
  uint uVar26;
  uint uVar28;
  undefined1 auVar23 [16];
  int iVar27;
  uint uVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  int iVar34;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar35 [16];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> inputs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  void *out;
  int aiStack_1d0 [2];
  Random rnd;
  void *in;
  _func_int **app_Stack_1b0 [48];
  
  dVar2 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar2 ^ 0x776002);
  inputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar9 = 1;
  if (1 < this->m_precision - PRECISION_MEDIUMP) {
    iVar9 = (uint)(this->m_precision == PRECISION_LOWP) * 2;
  }
  in._0_4_ = 0.0;
  in._4_4_ = 0.0;
  app_Stack_1b0[0]._0_4_ = 0.0;
  app_Stack_1b0[0]._4_4_ = 0.0;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
             (Vector<float,_4> *)&in);
  in = (void *)0x3f800000bf800000;
  app_Stack_1b0[0] = (_func_int **)0x3f800000bf800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
             (Vector<float,_4> *)&in);
  in = (void *)0xbf0000003f000000;
  app_Stack_1b0[0] = (_func_int **)0x3f000000bf000000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
             (Vector<float,_4> *)&in);
  in = (void *)0x3fc00000bfc00000;
  app_Stack_1b0[0] = (_func_int **)0x3fc00000bfc00000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
             (Vector<float,_4> *)&in);
  app_Stack_1b0[0]._0_4_ = -0.25;
  app_Stack_1b0[0]._4_4_ = 0.75;
  in = (void *)0xbf4000003e800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
             (Vector<float,_4> *)&in);
  iVar6 = 0xf;
  while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
    fVar15 = deRandom_getFloat(&rnd.m_rnd);
    fVar16 = deRandom_getFloat(&rnd.m_rnd);
    fVar17 = deRandom_getFloat(&rnd.m_rnd);
    fVar18 = deRandom_getFloat(&rnd.m_rnd);
    app_Stack_1b0[0]._4_4_ = fVar18 * 1.25 + -0.125;
    app_Stack_1b0[0]._0_4_ = fVar17 * 1.25 + -0.125;
    in = (void *)CONCAT44(fVar16 * 1.25 + -0.125,fVar15 * 1.25 + -0.125);
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
               (Vector<float,_4> *)&in);
  }
  iVar6 = 0x50;
  while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
    fVar15 = deRandom_getFloat(&rnd.m_rnd);
    fVar16 = deRandom_getFloat(&rnd.m_rnd);
    fVar17 = deRandom_getFloat(&rnd.m_rnd);
    fVar18 = deRandom_getFloat(&rnd.m_rnd);
    app_Stack_1b0[0]._4_4_ = fVar18 * 1e+06 + -100000.0;
    app_Stack_1b0[0]._0_4_ = fVar17 * 1e+06 + -100000.0;
    in = (void *)CONCAT44(fVar16 * 1e+06 + -100000.0,fVar15 * 1e+06 + -100000.0);
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&inputs,
               (Vector<float,_4> *)&in);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&outputs,(long)inputs.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)inputs.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4);
  in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_1b0);
  std::operator<<((ostream *)app_Stack_1b0,"Executing shader for ");
  std::ostream::_M_insert<unsigned_long>((ulong)app_Stack_1b0);
  std::operator<<((ostream *)app_Stack_1b0," input values");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_1b0);
  in = inputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  out = outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start;
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar1 = (this->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar1->_vptr_ShaderExecutor[6])
            (pSVar1,(ulong)((long)inputs.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)inputs.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4,&in,&out);
  uVar5 = (long)inputs.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)inputs.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  lVar7 = 0;
  lVar8 = 0;
  iVar6 = 0;
  pVVar3 = inputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar4 = inputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if ((int)((ulong)((long)pVVar4 - (long)pVVar3) >> 4) <= lVar8) break;
    auVar20 = *(undefined1 (*) [16])((long)pVVar3->m_data + lVar7);
    auVar23._8_4_ = 0x3f800000;
    auVar23._0_8_ = 0x3f8000003f800000;
    auVar23._12_4_ = 0x3f800000;
    auVar23 = minps(auVar23,auVar20);
    fVar15 = (float)(-(uint)(0.0 <= auVar20._0_4_) & (uint)(auVar23._0_4_ * 255.0));
    fVar16 = (float)(-(uint)(0.0 <= auVar20._4_4_) & (uint)(auVar23._4_4_ * 255.0));
    fVar17 = (float)(-(uint)(0.0 <= auVar20._8_4_) & (uint)(auVar23._8_4_ * 255.0));
    fVar18 = (float)(-(uint)(0.0 <= auVar20._12_4_) & (uint)(auVar23._12_4_ * 255.0));
    uVar11 = -(uint)(fVar15 < 0.0);
    uVar12 = -(uint)(fVar16 < 0.0);
    uVar13 = -(uint)(fVar17 < 0.0);
    uVar14 = -(uint)(fVar18 < 0.0);
    uVar19 = outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar8];
    hex_00.value._4_4_ = 0;
    hex_00.value._0_4_ = uVar19;
    uVar11 = (uint)((float)(uVar11 & 0xbf000000 | ~uVar11 & 0x3f000000) + fVar15);
    uVar12 = (uint)((float)(uVar12 & 0xbf000000 | ~uVar12 & 0x3f000000) + fVar16);
    uVar13 = (uint)((float)(uVar13 & 0xbf000000 | ~uVar13 & 0x3f000000) + fVar17);
    uVar14 = (uint)((float)(uVar14 & 0xbf000000 | ~uVar14 & 0x3f000000) + fVar18);
    uVar21 = -(uint)((int)uVar11 < 0xff);
    uVar26 = -(uint)((int)uVar12 < 0xff);
    uVar28 = -(uint)((int)uVar13 < 0xff);
    uVar31 = -(uint)((int)uVar14 < 0xff);
    uVar21 = ~uVar21 & 0xff | uVar11 & uVar21;
    uVar26 = ~uVar26 & 0xff | uVar12 & uVar26;
    uVar29 = ~uVar28 & 0xff | uVar13 & uVar28;
    uVar32 = ~uVar31 & 0xff | uVar14 & uVar31;
    uVar21 = -(uint)(0 < (int)uVar21) & uVar21;
    uVar26 = -(uint)(0 < (int)uVar26) & uVar26;
    uVar29 = -(uint)(0 < (int)uVar29) & uVar29;
    uVar32 = -(uint)(0 < (int)uVar32) & uVar32;
    uVar14 = uVar21 - (uVar19 & 0xff);
    uVar28 = uVar26 - (uVar19 >> 8 & 0xff);
    uVar31 = uVar29 - (uVar19 >> 0x10 & 0xff);
    uVar33 = uVar32 - (uVar19 >> 0x18);
    uVar19 = (int)uVar14 >> 0x1f;
    uVar11 = (int)uVar28 >> 0x1f;
    uVar12 = (int)uVar31 >> 0x1f;
    uVar13 = (int)uVar33 >> 0x1f;
    iVar22 = (uVar14 ^ uVar19) - uVar19;
    iVar27 = (uVar28 ^ uVar11) - uVar11;
    iVar30 = (uVar31 ^ uVar12) - uVar12;
    iVar34 = (uVar33 ^ uVar13) - uVar13;
    auVar20._0_4_ = -(uint)(iVar9 < iVar22);
    auVar20._4_4_ = -(uint)(iVar9 < iVar27);
    auVar20._8_4_ = -(uint)(iVar9 < iVar30);
    auVar20._12_4_ = -(uint)(iVar9 < iVar34);
    auVar24._4_4_ = auVar20._4_4_;
    auVar24._0_4_ = auVar20._4_4_;
    auVar24._8_4_ = auVar20._4_4_;
    auVar24._12_4_ = auVar20._4_4_;
    auVar35._4_4_ = auVar20._12_4_;
    auVar35._0_4_ = auVar20._8_4_;
    auVar35._8_4_ = auVar20._8_4_;
    auVar35._12_4_ = auVar20._12_4_;
    auVar25._4_4_ = auVar20._12_4_;
    auVar25._0_4_ = auVar20._12_4_;
    auVar25._8_4_ = auVar20._12_4_;
    auVar25._12_4_ = auVar20._12_4_;
    if (((auVar25 | auVar20 | auVar35 | auVar24) & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    {
      if (iVar6 < 10) {
        in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_1b0);
        std::operator<<((ostream *)app_Stack_1b0,"ERROR: Mismatch in value ");
        std::ostream::operator<<((ostringstream *)app_Stack_1b0,(int)lVar8);
        std::operator<<((ostream *)app_Stack_1b0,", expected packUnorm4x8(");
        tcu::operator<<((ostream *)app_Stack_1b0,
                        (Vector<float,_4> *)
                        ((long)(inputs.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7));
        std::operator<<((ostream *)app_Stack_1b0,") = ");
        hex.value._4_4_ = 0;
        hex.value._0_4_ = uVar21 | uVar26 << 8 | uVar29 << 0x10 | uVar32 << 0x18;
        tcu::Format::operator<<((ostream *)app_Stack_1b0,hex);
        std::operator<<((ostream *)app_Stack_1b0,", got ");
        tcu::Format::operator<<((ostream *)app_Stack_1b0,hex_00);
        std::operator<<((ostream *)app_Stack_1b0,"\n  diffs = ");
        out = (void *)CONCAT44(iVar27,iVar22);
        aiStack_1d0[1] = iVar34;
        aiStack_1d0[0] = iVar30;
        tcu::operator<<((ostream *)app_Stack_1b0,(Vector<int,_4> *)&out);
        std::operator<<((ostream *)app_Stack_1b0,", max diff = ");
        std::ostream::operator<<((ostringstream *)app_Stack_1b0,iVar9);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_1b0);
      }
      else if (iVar6 == 10) {
        in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_1b0);
        std::operator<<((ostream *)app_Stack_1b0,"...");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_1b0);
      }
      iVar6 = iVar6 + 1;
      pVVar3 = inputs.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar4 = inputs.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    lVar8 = lVar8 + 1;
    lVar7 = lVar7 + 0x10;
  }
  in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)app_Stack_1b0);
  iVar9 = (int)(uVar5 >> 4);
  std::ostream::operator<<((ostringstream *)app_Stack_1b0,iVar9 - iVar6);
  std::operator<<((ostream *)app_Stack_1b0," / ");
  std::ostream::operator<<((ostringstream *)app_Stack_1b0,iVar9);
  std::operator<<((ostream *)app_Stack_1b0," values passed");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)app_Stack_1b0);
  description = "Pass";
  if (iVar6 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(iVar6 != 0),description);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&inputs.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<tcu::Vec4>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1	:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 1	:		// (2^-10) * (2^8) + 1
												  m_precision == glu::PRECISION_LOWP	? 2	: 0;	// (2^-8) * (2^8) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
		inputs.push_back(tcu::Vec4(-1.0f, 1.0f, -1.0f, 1.0f));
		inputs.push_back(tcu::Vec4(0.5f, -0.5f, -0.5f, 0.5f));
		inputs.push_back(tcu::Vec4(-1.5f, 1.5f, -1.5f, 1.5f));
		inputs.push_back(tcu::Vec4(0.25f, -0.75f, -0.25f, 0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*1.25f - 0.125f;
			const float y = rnd.getFloat()*1.25f - 0.125f;
			const float z = rnd.getFloat()*1.25f - 0.125f;
			const float w = rnd.getFloat()*1.25f - 0.125f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 1e5f;
			const float y = rnd.getFloat()*1e6f - 1e5f;
			const float z = rnd.getFloat()*1e6f - 1e5f;
			const float w = rnd.getFloat()*1e6f - 1e5f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	ref0	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), 0.0f, 1.0f) * 255.0f), 0, (1<<8)-1);
				const deUint16	ref1	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), 0.0f, 1.0f) * 255.0f), 0, (1<<8)-1);
				const deUint16	ref2	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].z(), 0.0f, 1.0f) * 255.0f), 0, (1<<8)-1);
				const deUint16	ref3	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].w(), 0.0f, 1.0f) * 255.0f), 0, (1<<8)-1);
				const deUint32	ref		= (deUint32(ref3) << 24) | (deUint32(ref2) << 16) | (deUint32(ref1) << 8) | deUint32(ref0);
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint8)(res & 0xff);
				const deUint16	res1	= (deUint8)((res >> 8) & 0xff);
				const deUint16	res2	= (deUint8)((res >> 16) & 0xff);
				const deUint16	res3	= (deUint8)((res >> 24) & 0xff);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);
				const int		diff2	= de::abs((int)ref2 - (int)res2);
				const int		diff3	= de::abs((int)ref3 - (int)res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packUnorm4x8(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = " << tcu::IVec4(diff0, diff1, diff2, diff3) << ", max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}